

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O0

void __thiscall
agg::curve3_div::bezier
          (curve3_div *this,double x1,double y1,double x2,double y2,double x3,double y3)

{
  point_base<double> local_60;
  point_base<double> local_50;
  double local_40;
  double y3_local;
  double x3_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  curve3_div *this_local;
  
  local_40 = y3;
  y3_local = x3;
  x3_local = y2;
  y2_local = x2;
  x2_local = y1;
  y1_local = x1;
  x1_local = (double)this;
  point_base<double>::point_base(&local_50,x1,y1);
  pod_bvector<agg::point_base<double>,_6U>::add
            ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),&local_50);
  recursive_bezier(this,y1_local,x2_local,y2_local,x3_local,y3_local,local_40,0);
  point_base<double>::point_base(&local_60,y3_local,local_40);
  pod_bvector<agg::point_base<double>,_6U>::add
            ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),&local_60);
  return;
}

Assistant:

void curve3_div::bezier(double x1, double y1, 
                            double x2, double y2, 
                            double x3, double y3)
    {
        m_points.add(point_d(x1, y1));
        recursive_bezier(x1, y1, x2, y2, x3, y3, 0);
        m_points.add(point_d(x3, y3));
    }